

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LuaException.h
# Opt level: O2

void __thiscall luabridge::LuaException::~LuaException(LuaException *this)

{
  *(undefined ***)this = &PTR__LuaException_00184b58;
  std::__cxx11::string::~string((string *)&this->m_what);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~LuaException() throw() {}